

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureUnitTests.cpp
# Opt level: O0

void __thiscall deqp::gles2::Functional::TextureUnitCase::~TextureUnitCase(TextureUnitCase *this)

{
  TextureUnitCase *this_local;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureUnitCase_0328b9b0;
  deinit(this);
  std::vector<int,_std::allocator<int>_>::~vector(&this->m_ndx2dOrCube);
  std::vector<int,_std::allocator<int>_>::~vector(&this->m_unitTextures);
  std::vector<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>::~vector
            (&this->m_texturesCube);
  std::vector<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>::~vector(&this->m_textures2d);
  std::
  vector<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
  ::~vector(&this->m_textureParams);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->m_textureTypes);
  gles2::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

TextureUnitCase::~TextureUnitCase (void)
{
	TextureUnitCase::deinit();
}